

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseCatchInstrList(WastParser *this,CatchVector *catches)

{
  Var *this_00;
  anon_union_16_2_ecfd7102_for_Location_1 *paVar1;
  Expr *pEVar2;
  Expr *pEVar3;
  bool bVar4;
  TokenType TVar5;
  Result RVar6;
  bool bVar7;
  bool bVar8;
  Token token;
  Token local_f8;
  Catch local_b8;
  
  this_00 = &local_b8.var;
  bVar7 = false;
  bVar4 = false;
  do {
    TVar5 = Peek(this,0);
    if (1 < TVar5 - Catch) {
      if (bVar4) {
        return (Result)Ok;
      }
      paVar1 = &local_b8.loc.field_1;
      local_b8.loc.filename._M_len = (size_t)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"catch","");
      local_f8.loc.filename._M_len = 0;
      local_f8.loc.filename._M_str = (char *)0x0;
      local_f8.loc.field_1.field_1.offset =
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_f8,
                 &local_b8,&local_b8.var);
      RVar6 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&local_f8,(char *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_f8);
      if ((anon_union_16_2_ecfd7102_for_Location_1 *)local_b8.loc.filename._M_len == paVar1) {
        return (Result)RVar6.enum_;
      }
      operator_delete((void *)local_b8.loc.filename._M_len,
                      (long)local_b8.loc.field_1.field_1.offset + 1);
      return (Result)RVar6.enum_;
    }
    GetToken(&local_f8,this);
    local_b8.loc.field_1.field_1.offset = local_f8.loc.field_1.field_1.offset;
    local_b8.loc.filename._M_len = local_f8.loc.filename._M_len;
    local_b8.loc.filename._M_str = local_f8.loc.filename._M_str;
    Var::Var(this_00);
    local_b8.exprs.first_ = (Expr *)0x0;
    local_b8.exprs.last_ = (Expr *)0x0;
    local_b8.exprs.size_ = 0;
    Consume(&local_f8,this);
    if (local_f8.token_type_ == Catch) {
      RVar6 = ParseVar(this,this_00);
      bVar8 = bVar7;
      if (RVar6.enum_ == Error) {
        bVar8 = false;
        pEVar3 = local_b8.exprs.first_;
      }
      else {
LAB_0013fdb2:
        RVar6 = ParseInstrList(this,&local_b8.exprs);
        bVar7 = bVar8;
        if (RVar6.enum_ == Error) {
          bVar8 = false;
          pEVar3 = local_b8.exprs.first_;
        }
        else {
          std::vector<wabt::Catch,_std::allocator<wabt::Catch>_>::emplace_back<wabt::Catch>
                    (catches,&local_b8);
          bVar8 = true;
          bVar4 = true;
          pEVar3 = local_b8.exprs.first_;
        }
      }
    }
    else {
      bVar8 = true;
      if (!bVar7) goto LAB_0013fdb2;
      bVar8 = false;
      Error(this,0x1754be);
      pEVar3 = local_b8.exprs.first_;
    }
    while (pEVar3 != (Expr *)0x0) {
      pEVar2 = (pEVar3->super_intrusive_list_base<wabt::Expr>).next_;
      (*pEVar3->_vptr_Expr[1])();
      pEVar3 = pEVar2;
    }
    local_b8.exprs.first_ = (Expr *)0x0;
    local_b8.exprs.last_ = (Expr *)0x0;
    local_b8.exprs.size_ = 0;
    Var::~Var(this_00);
    if (!bVar8) {
      return (Result)Error;
    }
  } while( true );
}

Assistant:

Result WastParser::ParseCatchInstrList(CatchVector* catches) {
  WABT_TRACE(ParseCatchInstrList);
  bool parsedCatch = false;
  bool parsedCatchAll = false;

  while (IsCatch(Peek())) {
    Catch catch_(GetLocation());

    auto token = Consume();
    if (token.token_type() == TokenType::Catch) {
      CHECK_RESULT(ParseVar(&catch_.var));
    } else {
      if (parsedCatchAll) {
        Error(token.loc, "multiple catch_all clauses not allowed");
        return Result::Error;
      }
      parsedCatchAll = true;
    }

    CHECK_RESULT(ParseInstrList(&catch_.exprs));
    catches->push_back(std::move(catch_));
    parsedCatch = true;
  }

  if (!parsedCatch) {
    return ErrorExpected({"catch"});
  }

  return Result::Ok;
}